

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O2

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U> *this,deUintptr newSize)

{
  undefined8 *puVar1;
  ulong uVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  deUintptr val_1;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  deUintptr ndx;
  deUintptr dVar9;
  ulong uVar10;
  deUintptr val;
  deUintptr ndx_1;
  deUintptr dVar11;
  bool bVar12;
  
  dVar11 = this->m_numElements;
  uVar7 = newSize;
  if (newSize < dVar11) {
    for (; uVar7 < dVar11; uVar7 = uVar7 + 1) {
      vkt::anon_unknown_0::BuildGlslTask::~BuildGlslTask
                ((BuildGlslTask *)
                 ((ulong)((uint)uVar7 & 0xf) * 0xe0 + (long)this->m_pageTable[uVar7 >> 4]));
      dVar11 = this->m_numElements;
    }
    this->m_numElements = newSize;
  }
  else if (dVar11 < newSize) {
    uVar7 = this->m_capacity;
    if (uVar7 <= newSize) {
      uVar2 = newSize + 0xf >> 4;
      uVar5 = 0;
      ppvVar6 = (void **)0x0;
      if (this->m_pageTableCapacity < uVar2) {
        uVar10 = this->m_pageTableCapacity * 2;
        if (uVar10 <= uVar2) {
          uVar10 = uVar2;
        }
        ppvVar3 = (void **)MemPool::alloc(this->m_pool,uVar10 * 8);
        uVar5 = this->m_pageTableCapacity;
        for (uVar7 = 0; uVar8 = uVar5, uVar5 != uVar7; uVar7 = uVar7 + 1) {
          ppvVar3[uVar7] = this->m_pageTable[uVar7];
        }
        for (; uVar8 < uVar10; uVar8 = uVar8 + 1) {
          ppvVar3[uVar8] = (void *)0x0;
        }
        uVar7 = this->m_capacity;
        ppvVar6 = this->m_pageTable;
        uVar5 = uVar5 << 3;
        this->m_pageTable = ppvVar3;
        this->m_pageTableCapacity = uVar10;
      }
      uVar10 = uVar7 >> 4;
      dVar9 = uVar7 & 0xfffffffffffffff0;
      while( true ) {
        pvVar4 = (void *)((long)ppvVar6 + 7U & 0xfffffffffffffff8);
        uVar7 = (long)pvVar4 + (0xe00 - (long)ppvVar6);
        bVar12 = uVar5 < uVar7;
        uVar5 = uVar5 - uVar7;
        if (bVar12) break;
        this->m_pageTable[uVar10] = pvVar4;
        uVar10 = uVar10 + 1;
        ppvVar6 = (void **)((long)pvVar4 + 0xe00);
        dVar9 = dVar9 + 0x10;
      }
      for (; uVar10 < uVar2; uVar10 = uVar10 + 1) {
        pvVar4 = MemPool::alignedAlloc(this->m_pool,0xe00,8);
        this->m_pageTable[uVar10] = pvVar4;
        dVar9 = dVar9 + 0x10;
      }
      this->m_capacity = dVar9;
    }
    this->m_numElements = newSize;
    for (; dVar11 < newSize; dVar11 = dVar11 + 1) {
      puVar1 = (undefined8 *)
               ((long)this->m_pageTable[dVar11 >> 4] + (ulong)((uint)dVar11 & 0xf) * 0xe0);
      *puVar1 = &PTR_execute_00bc7200;
      memset(puVar1 + 1,0,0xac);
      puVar1[0x17] = 0;
      puVar1[0x18] = 0;
      *(undefined8 *)((long)puVar1 + 0xc1) = 0;
      *(undefined8 *)((long)puVar1 + 0xc9) = 0;
      puVar1[0x1b] = 0;
      newSize = this->m_numElements;
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}